

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

bool __thiscall CSound::IsPlaying(CSound *this,CSampleHandle SampleID)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  int i;
  CSample *pSample;
  bool Ret;
  int local_2c;
  bool local_19;
  bool local_d;
  CSampleHandle local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ISound::CSampleHandle::IsValid((CSampleHandle *)0x13ee59);
  if (bVar1) {
    local_19 = false;
    lock_wait((LOCK)0x13ee78);
    iVar2 = ISound::CSampleHandle::Id(&local_c);
    for (local_2c = 0; local_2c < 0x40; local_2c = local_2c + 1) {
      if (m_aVoices[local_2c].m_pSample == m_aSamples + iVar2) {
        local_19 = true;
      }
    }
    lock_unlock((LOCK)0x13eee4);
    local_d = local_19;
  }
  else {
    local_d = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

bool CSound::IsPlaying(CSampleHandle SampleID)
{
	if(!SampleID.IsValid())
		return false;

	bool Ret = false;
	lock_wait(m_SoundLock);
	CSample *pSample = &m_aSamples[SampleID.Id()];
	for(int i = 0; i < NUM_VOICES; i++)
	{
		if(m_aVoices[i].m_pSample == pSample)
		{
			Ret = true;
		}
	}
	lock_unlock(m_SoundLock);
	return Ret;
}